

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypedArray.cpp
# Opt level: O0

Var __thiscall
Js::TypedArrayBase::FindMinOrMax<double,true>
          (TypedArrayBase *this,ScriptContext *scriptContext,bool findMax)

{
  double value;
  double *pdVar1;
  code *pcVar2;
  bool bVar3;
  uint32 uVar4;
  uint32 uVar5;
  uint uVar6;
  BOOL BVar7;
  ArrayBufferBase *pAVar8;
  undefined4 *puVar9;
  JavascriptLibrary *this_00;
  TypedArrayBase *pTVar10;
  double compare;
  double dStack_40;
  uint i;
  double currentRes;
  uint len;
  double *typedBuffer;
  bool findMax_local;
  ScriptContext *scriptContext_local;
  TypedArrayBase *this_local;
  
  pdVar1 = (double *)this->buffer;
  uVar4 = ArrayObject::GetLength((ArrayObject *)this);
  uVar5 = GetByteOffset(this);
  pAVar8 = ArrayBufferParent::GetArrayBuffer(&this->super_ArrayBufferParent);
  uVar6 = (*(pAVar8->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
            super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x71])();
  if ((ulong)uVar6 < (ulong)uVar5 + 8) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/TypedArray.cpp"
                                ,0x9e8,
                                "(sizeof(T)+GetByteOffset() <= GetArrayBuffer()->GetByteLength())",
                                "sizeof(T)+GetByteOffset() <= GetArrayBuffer()->GetByteLength()");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 0;
  }
  dStack_40 = *pdVar1;
  compare._4_4_ = 0;
  do {
    if (uVar4 <= compare._4_4_) {
      pTVar10 = (TypedArrayBase *)JavascriptNumber::ToVarNoCheck(dStack_40,scriptContext);
      return pTVar10;
    }
    uVar5 = GetByteOffset(this);
    pAVar8 = ArrayBufferParent::GetArrayBuffer(&this->super_ArrayBufferParent);
    uVar6 = (*(pAVar8->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
              super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x71])();
    if ((ulong)uVar6 < (ulong)(compare._4_4_ + 1) * 8 + (ulong)uVar5) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar9 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/TypedArray.cpp"
                                  ,0x9ec,
                                  "((i + 1) * sizeof(T)+GetByteOffset() <= GetArrayBuffer()->GetByteLength())"
                                  ,
                                  "(i + 1) * sizeof(T)+GetByteOffset() <= GetArrayBuffer()->GetByteLength()"
                                 );
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar9 = 0;
    }
    value = pdVar1[compare._4_4_];
    BVar7 = JavascriptNumber::IsNan(value);
    if (BVar7 != 0) {
      this_00 = ScriptContext::GetLibrary(scriptContext);
      pTVar10 = (TypedArrayBase *)
                JavascriptLibraryBase::GetNaN(&this_00->super_JavascriptLibraryBase);
      return pTVar10;
    }
    if (findMax) {
      if (dStack_40 < value) {
LAB_013a4ff4:
        dStack_40 = value;
      }
    }
    else if ((value < dStack_40) ||
            (((value == 0.0 && (!NAN(value))) &&
             (BVar7 = JavascriptNumber::IsNegZero(dStack_40), BVar7 != 0)))) goto LAB_013a4ff4;
    compare._4_4_ = compare._4_4_ + 1;
  } while( true );
}

Assistant:

Var TypedArrayBase::FindMinOrMax(Js::ScriptContext * scriptContext, bool findMax)
    {
        T* typedBuffer = (T*)this->buffer;
        uint len = this->GetLength();

        Assert(sizeof(T)+GetByteOffset() <= GetArrayBuffer()->GetByteLength());
        T currentRes = typedBuffer[0];
        for (uint i = 0; i < len; i++)
        {
            Assert((i + 1) * sizeof(T)+GetByteOffset() <= GetArrayBuffer()->GetByteLength());
            T compare = typedBuffer[i];
            if (checkNaNAndNegZero && JavascriptNumber::IsNan(double(compare)))
            {
                return scriptContext->GetLibrary()->GetNaN();
            }
            if (findMax ? currentRes < compare : currentRes > compare ||
                (checkNaNAndNegZero && compare == 0 && Js::JavascriptNumber::IsNegZero(double(currentRes))))
            {
                currentRes = compare;
            }
        }
        return Js::JavascriptNumber::ToVarNoCheck(currentRes, scriptContext);
    }